

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_font_glyph * nk_font_find_glyph(nk_font *font,nk_rune unicode)

{
  int *piVar1;
  uint uVar2;
  nk_rune *pnVar3;
  int iVar4;
  nk_font_config *pnVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  
  if (font != (nk_font *)0x0) {
    iVar4 = 0;
    if (font->glyphs != (nk_font_glyph *)0x0) {
      pnVar5 = font->config;
      do {
        pnVar3 = pnVar5->range;
        if (pnVar3 != (nk_rune *)0x0) {
          lVar7 = 0;
          do {
            piVar1 = (int *)((long)pnVar3 + lVar7);
            lVar7 = lVar7 + 4;
          } while (*piVar1 != 0);
          uVar6 = (uint)((lVar7 >> 2) - (lVar7 >> 0x3f) >> 1);
          if (0 < (int)uVar6) {
            uVar8 = 0;
            do {
              uVar2 = pnVar3[uVar8 * 2];
              if ((uVar2 <= unicode) && (unicode <= pnVar3[uVar8 * 2 + 1])) {
                return font->glyphs + ((iVar4 + unicode) - uVar2);
              }
              iVar4 = (iVar4 - uVar2) + pnVar3[uVar8 * 2 + 1] + 1;
              uVar8 = uVar8 + 1;
            } while ((uVar6 & 0x7fffffff) != uVar8);
          }
        }
        pnVar5 = pnVar5->n;
        if (pnVar5 == font->config) {
          return font->fallback;
        }
      } while( true );
    }
  }
  return (nk_font_glyph *)0x0;
}

Assistant:

NK_API const struct nk_font_glyph*
nk_font_find_glyph(struct nk_font *font, nk_rune unicode)
{
int i = 0;
int count;
int total_glyphs = 0;
const struct nk_font_glyph *glyph = 0;
const struct nk_font_config *iter = 0;

NK_ASSERT(font);
NK_ASSERT(font->glyphs);
NK_ASSERT(font->info.ranges);
if (!font || !font->glyphs) return 0;

glyph = font->fallback;
iter = font->config;
do {count = nk_range_count(iter->range);
for (i = 0; i < count; ++i) {
nk_rune f = iter->range[(i*2)+0];
nk_rune t = iter->range[(i*2)+1];
int diff = (int)((t - f) + 1);
if (unicode >= f && unicode <= t)
return &font->glyphs[((nk_rune)total_glyphs + (unicode - f))];
total_glyphs += diff;
}
} while ((iter = iter->n) != font->config);
return glyph;
}